

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O1

bool __thiscall flow::lang::Lexer::continueParseRegEx(Lexer *this,char delim)

{
  long *plVar1;
  Token TVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  iVar5 = this->currentChar_;
  iVar3 = (int)delim;
  if (iVar5 != -1) {
    iVar4 = -1;
    do {
      plVar1 = (long *)(this->contexts_).
                       super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[4]._M_next;
      if (((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 2) != 0) ||
         (iVar4 != 0x5c && iVar5 == iVar3)) break;
      std::__cxx11::string::push_back((char)this + -0x58);
      iVar4 = this->currentChar_;
      nextChar(this,true);
      iVar5 = this->currentChar_;
    } while (iVar5 != -1);
  }
  TVar2 = Unknown;
  if (iVar5 == iVar3) {
    nextChar(this,true);
    TVar2 = RegExp;
  }
  this->token_ = TVar2;
  return iVar5 == iVar3;
}

Assistant:

bool Lexer::continueParseRegEx(char delim) {
  int last = -1;

  stringValue_.clear();

  while (!eof() && (currentChar() != delim || (last == '\\'))) {
    stringValue_ += static_cast<char>(currentChar());
    last = currentChar();
    nextChar();
  }

  if (currentChar() == delim) {
    nextChar();
    token_ = Token::RegExp;
    return true;
  }

  token_ = Token::Unknown;
  return false;
}